

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O3

int cdef_sb_row_worker_hook(void *arg1,void *arg2)

{
  uint8_t uVar1;
  AV1_COMMON *cm;
  pthread_mutex_t *__mutex;
  long lVar2;
  MACROBLOCKD *xd;
  int iVar3;
  int iVar4;
  int v_start;
  int iVar5;
  int *piVar6;
  int iVar7;
  AV1CdefRowSync *cdef_row_mt;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  int cur_fbr;
  
  cm = *arg2;
  iVar5 = (cm->mi_params).mi_rows;
  iVar4 = iVar5 + 0x1e;
  if (-1 < iVar5 + 0xf) {
    iVar4 = iVar5 + 0xf;
  }
  __mutex = *arg1;
  iVar3 = _setjmp((__jmp_buf_tag *)((long)arg2 + 0x130));
  if (iVar3 == 0) {
    *(undefined4 *)((long)arg2 + 0x128) = 1;
    uVar1 = cm->seq_params->monochrome;
    pthread_mutex_lock(*arg1);
    if (*(char *)((long)arg1 + 0x1c) == '\0') {
      do {
        if (*(int *)((long)arg1 + 0x10) != 0) break;
        iVar5 = *(int *)((long)arg1 + 0x14);
        *(uint *)((long)arg1 + 0x14) = iVar5 + 1U;
        if (iVar5 + 1U == iVar4 >> 4) {
          *(undefined4 *)((long)arg1 + 0x10) = 1;
        }
        pthread_mutex_unlock(*arg1);
        xd = *(MACROBLOCKD **)((long)arg2 + 8);
        av1_cdef_fb_row(cm,xd,(uint16_t **)((long)arg2 + 0x30),(uint16_t **)((long)arg2 + 0x10),
                        *(uint16_t **)((long)arg2 + 0x28),iVar5,
                        *(cdef_init_fb_row_t *)((long)arg2 + 0x48),(AV1CdefSyncData *)arg1,
                        (aom_internal_error_info *)((long)arg2 + 0x58));
        if (*(int *)((long)arg2 + 0x50) != 0) {
          piVar6 = &xd->plane[0].subsampling_y;
          uVar8 = 0;
          do {
            iVar7 = 0x10 << (2U - (char)*piVar6 & 0x1f);
            v_start = iVar5 * iVar7;
            iVar7 = iVar7 + v_start;
            iVar3 = *(int *)((long)(cm->cur_frame->buf).store_buf_adr +
                            (ulong)(uVar8 != 0) * 4 + -0x30);
            if (iVar3 <= iVar7) {
              iVar7 = iVar3;
            }
            aom_extend_frame_borders_plane_row_c(&cm->cur_frame->buf,(int)uVar8,v_start,iVar7);
            if (uVar1 != '\0') break;
            piVar6 = piVar6 + 0x28c;
            bVar10 = uVar8 < 2;
            uVar8 = uVar8 + 1;
          } while (bVar10);
        }
        pthread_mutex_lock(*arg1);
      } while (*(char *)((long)arg1 + 0x1c) != '\x01');
    }
    pthread_mutex_unlock(*arg1);
    *(undefined4 *)((long)arg2 + 0x128) = 0;
    iVar5 = 1;
  }
  else {
    *(undefined4 *)((long)arg2 + 0x128) = 0;
    pthread_mutex_lock(__mutex);
    *(undefined1 *)((long)arg1 + 0x1c) = 1;
    pthread_mutex_unlock(__mutex);
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    else {
      uVar8 = (ulong)(uint)(iVar4 >> 4);
      iVar5 = 0;
      lVar9 = 0;
      do {
        lVar2 = *(long *)((long)arg1 + 8);
        pthread_mutex_lock(*(pthread_mutex_t **)(lVar2 + lVar9));
        pthread_cond_signal(*(pthread_cond_t **)(lVar2 + 8 + lVar9));
        *(undefined4 *)(lVar2 + 0x10 + lVar9) = 1;
        pthread_mutex_unlock(*(pthread_mutex_t **)(lVar2 + lVar9));
        lVar9 = lVar9 + 0x18;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
  }
  return iVar5;
}

Assistant:

static int cdef_sb_row_worker_hook(void *arg1, void *arg2) {
  AV1CdefSync *const cdef_sync = (AV1CdefSync *)arg1;
  AV1CdefWorkerData *const cdef_worker = (AV1CdefWorkerData *)arg2;
  AV1_COMMON *cm = cdef_worker->cm;
  const int nvfb = (cm->mi_params.mi_rows + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;

#if CONFIG_MULTITHREAD
  pthread_mutex_t *job_mutex_ = cdef_sync->mutex_;
#endif
  struct aom_internal_error_info *const error_info = &cdef_worker->error_info;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(job_mutex_);
    cdef_sync->cdef_mt_exit = true;
    pthread_mutex_unlock(job_mutex_);
#endif
    // In case of cdef row-multithreading, the worker on a filter block row
    // (fbr) waits for the line buffers (top and bottom) copy of the above row.
    // Hence, in case a thread (main/worker) encounters an error before copying
    // of the line buffers, update that line buffer copy is complete in order to
    // avoid dependent workers waiting indefinitely.
    set_cdef_init_fb_row_done(cdef_sync, nvfb);
    return 0;
  }
  error_info->setjmp = 1;

  volatile int cur_fbr;
  const int num_planes = av1_num_planes(cm);
  while (get_cdef_row_next_job(cdef_sync, &cur_fbr, nvfb)) {
    MACROBLOCKD *xd = cdef_worker->xd;
    av1_cdef_fb_row(cm, xd, cdef_worker->linebuf, cdef_worker->colbuf,
                    cdef_worker->srcbuf, cur_fbr,
                    cdef_worker->cdef_init_fb_row_fn, cdef_sync, error_info);
    if (cdef_worker->do_extend_border) {
      for (int plane = 0; plane < num_planes; ++plane) {
        const YV12_BUFFER_CONFIG *ybf = &cm->cur_frame->buf;
        const int is_uv = plane > 0;
        const int mi_high = MI_SIZE_LOG2 - xd->plane[plane].subsampling_y;
        const int unit_height = MI_SIZE_64X64 << mi_high;
        const int v_start = cur_fbr * unit_height;
        const int v_end =
            AOMMIN(v_start + unit_height, ybf->crop_heights[is_uv]);
        aom_extend_frame_borders_plane_row(ybf, plane, v_start, v_end);
      }
    }
  }
  error_info->setjmp = 0;
  return 1;
}